

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsInput
helicsFederateRegisterGlobalInput
          (HelicsFederate fed,char *key,HelicsDataTypes type,char *units,HelicsError *err)

{
  string_view type_00;
  string_view name;
  bool bVar1;
  Input *pIVar2;
  pointer pIVar3;
  HelicsFederate in_RCX;
  int in_EDX;
  long in_RSI;
  unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *in_RDI;
  HelicsError *in_R8;
  __sv_type _Var4;
  __single_object inp;
  shared_ptr<helics::ValueFederate> fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff30;
  HelicsFederate in_stack_ffffffffffffff38;
  ValueFederate *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  shared_ptr<helics::ValueFederate> *in_stack_ffffffffffffff70;
  shared_ptr<helics::ValueFederate> *in_stack_ffffffffffffff78;
  shared_ptr<helics::ValueFederate> *inp_00;
  char *fed_00;
  __sv_type in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  HelicsInput local_8;
  
  getValueFedSharedPtr(in_stack_ffffffffffffff38,(HelicsError *)in_stack_ffffffffffffff30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc0);
  if (!bVar1) {
    local_8 = (HelicsInput)0x0;
    goto LAB_001cd2ed;
  }
  if ((in_EDX < 0) || (9 < in_EDX)) {
    if (in_EDX == 0x19) {
      local_8 = helicsFederateRegisterGlobalTypeInput
                          (in_RCX,(char *)in_R8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                           (HelicsError *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      goto LAB_001cd2ed;
    }
    if ((in_EDX != 0x62ae) && (in_EDX != 0x1e)) {
      assignError(in_R8,-4,"unrecognized type code");
      local_8 = (HelicsInput)0x0;
      goto LAB_001cd2ed;
    }
  }
  std::make_unique<helics::InputObject>();
  std::__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x1cd0ec);
  if (in_RSI == 0) {
    in_stack_ffffffffffffff90 =
         std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  helics::typeNameStringRef_abi_cxx11_(in_stack_ffffffffffffff90._M_str._4_4_);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
  fed_00 = (char *)_Var4._M_len;
  if (in_RCX == (HelicsFederate)0x0) {
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff70 = (shared_ptr<helics::ValueFederate> *)_Var4._M_len;
    in_stack_ffffffffffffff78 = (shared_ptr<helics::ValueFederate> *)_Var4._M_str;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  name._M_str = fed_00;
  name._M_len = (size_t)in_stack_ffffffffffffff78;
  type_00._M_str = (char *)in_stack_ffffffffffffff70;
  type_00._M_len = in_stack_ffffffffffffff68;
  inp_00 = in_stack_ffffffffffffff78;
  pIVar2 = helics::ValueFederate::registerGlobalInput
                     (in_stack_ffffffffffffff60,name,type_00,in_stack_ffffffffffffff90);
  pIVar3 = std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::
           operator->((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
                      0x1cd1ca);
  pIVar3->inputPtr = pIVar2;
  std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::operator->
            ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)0x1cd1dd)
  ;
  std::shared_ptr<helics::ValueFederate>::operator=
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::unique_ptr
            ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
             in_stack_ffffffffffffff78,
             (unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
             in_stack_ffffffffffffff70);
  local_8 = anon_unknown.dwarf_5d1c2::addInput
                      (fed_00,(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                               *)inp_00);
  std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
            (in_RDI);
  std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
            (in_RDI);
LAB_001cd2ed:
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1cd2fa)
  ;
  return local_8;
}

Assistant:

HelicsInput
    helicsFederateRegisterGlobalInput(HelicsFederate fed, const char* key, HelicsDataTypes type, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    if ((type < HELICS_DATA_TYPE_STRING) || (type > HELICS_DATA_TYPE_CHAR)) {
        if (type == HELICS_DATA_TYPE_RAW) {
            return helicsFederateRegisterGlobalTypeInput(fed, key, "raw", units, err);
        }
        if (type != HELICS_DATA_TYPE_ANY && type != HELICS_DATA_TYPE_JSON) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, unknownTypeCode);
            return nullptr;
        }
    }

    try {
        auto inp = std::make_unique<helics::InputObject>();
        inp->inputPtr = &(fedObj->registerGlobalInput(AS_STRING_VIEW(key),
                                                      helics::typeNameStringRef(static_cast<helics::DataType>(type)),
                                                      AS_STRING_VIEW(units)));
        inp->fedptr = std::move(fedObj);
        return addInput(fed, std::move(inp));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}